

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVectorBase<slang::Diagnostic>::cleanup
          (SmallVectorBase<slang::Diagnostic> *this,EVP_PKEY_CTX *ctx)

{
  Diagnostic *__location;
  long lVar1;
  
  __location = this->data_;
  if (this->len != 0) {
    lVar1 = this->len * 0x70;
    do {
      std::ranges::__destroy_at_fn::operator()<slang::Diagnostic>
                ((__destroy_at_fn *)&std::ranges::destroy_at,__location);
      __location = __location + 1;
      lVar1 = lVar1 + -0x70;
    } while (lVar1 != 0);
    __location = this->data_;
  }
  if (__location != (Diagnostic *)this->firstElement) {
    operator_delete(__location);
    return;
  }
  return;
}

Assistant:

void cleanup() {
        std::ranges::destroy(*this);
        if (!isSmall())
            ::operator delete(data_);
    }